

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Initialize(ImGuiContext *context)

{
  int *piVar1;
  ImVector<ImGuiViewport_*> *pIVar2;
  int iVar3;
  ImGuiSettingsHandler *pIVar4;
  ImGuiViewportP **ppIVar5;
  ImGuiViewport **ppIVar6;
  ImU32 IVar7;
  ImGuiSettingsHandler *__dest;
  ImGuiViewportP *pIVar8;
  ImGuiViewportP **__dest_00;
  ImGuiViewport **__dest_01;
  int iVar9;
  int iVar10;
  
  IVar7 = ImHashStr("Window",0,0);
  iVar10 = (context->SettingsHandlers).Size;
  iVar3 = (context->SettingsHandlers).Capacity;
  if (iVar10 == iVar3) {
    iVar10 = iVar10 + 1;
    if (iVar3 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar3 / 2 + iVar3;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar3 < iVar10) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiSettingsHandler *)
               (*GImAllocatorAllocFunc)((long)iVar10 * 0x30,GImAllocatorUserData);
      pIVar4 = (context->SettingsHandlers).Data;
      if (pIVar4 != (ImGuiSettingsHandler *)0x0) {
        memcpy(__dest,pIVar4,(long)(context->SettingsHandlers).Size * 0x30);
        pIVar4 = (context->SettingsHandlers).Data;
        if ((pIVar4 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (context->SettingsHandlers).Data = __dest;
      (context->SettingsHandlers).Capacity = iVar10;
    }
  }
  pIVar4 = (context->SettingsHandlers).Data;
  iVar10 = (context->SettingsHandlers).Size;
  pIVar4[iVar10].TypeName = "Window";
  pIVar4[iVar10].TypeHash = IVar7;
  *(undefined4 *)&pIVar4[iVar10].field_0xc = 0;
  pIVar4[iVar10].ReadOpenFn = WindowSettingsHandler_ReadOpen;
  pIVar4[iVar10].ReadLineFn = WindowSettingsHandler_ReadLine;
  pIVar4[iVar10].WriteAllFn = WindowSettingsHandler_WriteAll;
  pIVar4[iVar10].UserData = (void *)0x0;
  (context->SettingsHandlers).Size = (context->SettingsHandlers).Size + 1;
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  pIVar8 = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0x110,GImAllocatorUserData);
  ImGuiViewportP::ImGuiViewportP(pIVar8);
  (pIVar8->super_ImGuiViewport).ID = 0x11111111;
  *(undefined4 *)&(pIVar8->super_ImGuiViewport).field_0x54 = 0;
  pIVar8->PlatformWindowCreated = true;
  iVar10 = (context->Viewports).Size;
  iVar3 = (context->Viewports).Capacity;
  if (iVar10 == iVar3) {
    iVar10 = iVar10 + 1;
    if (iVar3 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar3 / 2 + iVar3;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar3 < iVar10) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest_00 = (ImGuiViewportP **)
                  (*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
      ppIVar5 = (context->Viewports).Data;
      if (ppIVar5 != (ImGuiViewportP **)0x0) {
        memcpy(__dest_00,ppIVar5,(long)(context->Viewports).Size << 3);
        ppIVar5 = (context->Viewports).Data;
        if ((ppIVar5 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
      }
      (context->Viewports).Data = __dest_00;
      (context->Viewports).Capacity = iVar10;
    }
  }
  (context->Viewports).Data[(context->Viewports).Size] = pIVar8;
  (context->Viewports).Size = (context->Viewports).Size + 1;
  ppIVar5 = (context->Viewports).Data;
  (context->PlatformIO).MainViewport = &(*ppIVar5)->super_ImGuiViewport;
  pIVar8 = *ppIVar5;
  iVar10 = (context->PlatformIO).Viewports.Size;
  iVar3 = (context->PlatformIO).Viewports.Capacity;
  if (iVar10 == iVar3) {
    iVar10 = iVar10 + 1;
    if (iVar3 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar3 / 2 + iVar3;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar3 < iVar10) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest_01 = (ImGuiViewport **)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData)
      ;
      ppIVar6 = (context->PlatformIO).Viewports.Data;
      if (ppIVar6 != (ImGuiViewport **)0x0) {
        memcpy(__dest_01,ppIVar6,(long)(context->PlatformIO).Viewports.Size << 3);
        ppIVar6 = (context->PlatformIO).Viewports.Data;
        if ((ppIVar6 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
      }
      (context->PlatformIO).Viewports.Data = __dest_01;
      (context->PlatformIO).Viewports.Capacity = iVar10;
    }
  }
  (context->PlatformIO).Viewports.Data[(context->PlatformIO).Viewports.Size] =
       &pIVar8->super_ImGuiViewport;
  pIVar2 = &(context->PlatformIO).Viewports;
  pIVar2->Size = pIVar2->Size + 1;
  DockContextInitialize(context);
  context->Initialized = true;
  return;
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

#ifdef IMGUI_HAS_TABLE
    // Add .ini handle for ImGuiTable type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Table";
        ini_handler.TypeHash = ImHashStr("Table");
        ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
        ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    viewport->ID = IMGUI_VIEWPORT_DEFAULT_ID;
    viewport->Idx = 0;
    viewport->PlatformWindowCreated = true;
    g.Viewports.push_back(viewport);
    g.PlatformIO.MainViewport = g.Viewports[0]; // Make it accessible in public-facing GetPlatformIO() immediately (before the first call to EndFrame)
    g.PlatformIO.Viewports.push_back(g.Viewports[0]);

    // Extensions
    IM_ASSERT(g.DockContext == NULL);
    DockContextInitialize(&g);
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}